

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

void cram_ref_decr(refs_t *r,int id)

{
  long lVar1;
  int iVar2;
  ref_entry **pprVar3;
  ref_entry *prVar4;
  long lVar5;
  char *__ptr;
  
  pthread_mutex_lock((pthread_mutex_t *)&r->lock);
  if (-1 < id) {
    pprVar3 = r->ref_id;
    prVar4 = pprVar3[(uint)id];
    if (prVar4->seq != (char *)0x0) {
      lVar5 = prVar4->count;
      lVar1 = lVar5 + -1;
      prVar4->count = lVar1;
      if (lVar5 < 2) {
        if (lVar1 != 0) {
          __assert_fail("r->ref_id[id]->count == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                        ,0x82b,"void cram_ref_decr_locked(refs_t *, int)");
        }
        if (((-1 < (long)r->last_id) && (prVar4 = pprVar3[r->last_id], prVar4->count < 1)) &&
           (__ptr = prVar4->seq, __ptr != (char *)0x0)) {
          free(__ptr);
          pprVar3 = r->ref_id;
          iVar2 = r->last_id;
          pprVar3[iVar2]->seq = (char *)0x0;
          pprVar3[iVar2]->length = 0;
        }
        r->last_id = id;
      }
      goto LAB_00124985;
    }
  }
  if (r->ref_id[id]->count < 0) {
    __assert_fail("r->ref_id[id]->count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                  ,0x826,"void cram_ref_decr_locked(refs_t *, int)");
  }
LAB_00124985:
  pthread_mutex_unlock((pthread_mutex_t *)&r->lock);
  return;
}

Assistant:

void cram_ref_decr(refs_t *r, int id) {
    pthread_mutex_lock(&r->lock);
    cram_ref_decr_locked(r, id);
    pthread_mutex_unlock(&r->lock);
}